

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall
FValueTextItem::FValueTextItem
          (FValueTextItem *this,int x,int y,int height,char *text,FFont *font,EColorRange color,
          EColorRange valuecolor,FName *action,FName *values)

{
  bool bVar1;
  uint uVar2;
  Pair *pPVar3;
  char *pcVar4;
  uint local_58;
  FName local_54;
  uint i;
  FOptionValues **opt;
  FName local_34;
  FFont *local_30;
  FFont *font_local;
  char *text_local;
  int local_18;
  int height_local;
  int y_local;
  int x_local;
  FValueTextItem *this_local;
  
  local_30 = font;
  font_local = (FFont *)text;
  text_local._4_4_ = height;
  local_18 = y;
  height_local = x;
  _y_local = this;
  FName::FName(&local_34,action);
  FListMenuItemSelectable::FListMenuItemSelectable
            (&this->super_FListMenuItemSelectable,x,y,height,&local_34,-1);
  (this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FValueTextItem_00b64160;
  TArray<FString,_FString>::TArray(&this->mSelections);
  FString::FString(&this->mText);
  FString::operator=(&this->mText,(char *)font_local);
  this->mFont = local_30;
  this->mFontColor = color;
  this->mFontColor2 = valuecolor;
  this->mSelection = 0;
  bVar1 = FName::operator!=(values,NAME_None);
  if (bVar1) {
    FName::FName(&local_54,values);
    _i = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::CheckKey
                   (&OptionValues,&local_54);
    if (_i != (FOptionValues **)0x0) {
      for (local_58 = 0;
          uVar2 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Size(&(*_i)->mValues),
          local_58 < uVar2; local_58 = local_58 + 1) {
        pPVar3 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::operator[]
                           (&(*_i)->mValues,(ulong)local_58);
        pcVar4 = FString::operator_cast_to_char_(&pPVar3->Text);
        (*(this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem[8])
                  (this,(ulong)local_58,pcVar4);
      }
    }
  }
  return;
}

Assistant:

FValueTextItem::FValueTextItem(int x, int y, int height, const char *text, FFont *font, EColorRange color, EColorRange valuecolor, FName action, FName values)
: FListMenuItemSelectable(x, y, height, action)
{
	mText = text;
	mFont = font;
	mFontColor = color;
	mFontColor2 = valuecolor;
	mSelection = 0;
	if (values != NAME_None)
	{
		FOptionValues **opt = OptionValues.CheckKey(values);
		if (opt != NULL) 
		{
			for(unsigned i=0;i<(*opt)->mValues.Size(); i++)
			{
				SetString(i, (*opt)->mValues[i].Text);
			}
		}
	}
}